

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiCamera *pCamera)

{
  float fVar1;
  
  if (pCamera->mClipPlaneFar <= pCamera->mClipPlaneNear) {
    ReportError(this,"aiCamera::mClipPlaneFar must be >= aiCamera::mClipPlaneNear");
  }
  fVar1 = pCamera->mHorizontalFOV;
  if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < 3.1415927)) {
    return;
  }
  ReportWarning(this,"%f is not a valid value for aiCamera::mHorizontalFOV",(double)fVar1);
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiCamera* pCamera)
{
    if (pCamera->mClipPlaneFar <= pCamera->mClipPlaneNear)
        ReportError("aiCamera::mClipPlaneFar must be >= aiCamera::mClipPlaneNear");

    // FIX: there are many 3ds files with invalid FOVs. No reason to
    // reject them at all ... a warning is appropriate.
    if (!pCamera->mHorizontalFOV || pCamera->mHorizontalFOV >= (float)AI_MATH_PI)
        ReportWarning("%f is not a valid value for aiCamera::mHorizontalFOV",pCamera->mHorizontalFOV);
}